

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpikingPopulation.h
# Opt level: O2

void __thiscall
SpikingPopulation::SpikingPopulation
          (SpikingPopulation *this,int amount,string *type,Parameters *param)

{
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)type);
  Population::Population(&this->super_Population,amount,&local_40,param);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_Population)._vptr_Population = (_func_int **)&PTR_update_00136bc0;
  return;
}

Assistant:

SpikingPopulation(int amount, std::string type) : Population(amount, type) { }